

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O0

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::pipeline::bindBuffer
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          DeviceInterface *vk,VkDevice device,Allocator *allocator,VkBuffer buffer,
          MemoryRequirement requirement)

{
  Allocator *pAVar1;
  VkDevice pVVar2;
  deUint64 dVar3;
  VkResult result;
  Allocation *pAVar4;
  VkDeviceMemory VVar5;
  VkDeviceSize VVar6;
  VkMemoryRequirements local_58;
  undefined1 local_39;
  Allocator *local_38;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkBuffer VStack_18;
  MemoryRequirement requirement_local;
  VkBuffer buffer_local;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *alloc;
  
  local_39 = 0;
  local_38 = allocator;
  allocator_local = (Allocator *)device;
  device_local = (VkDevice)vk;
  vk_local._4_4_ = requirement.m_flags;
  VStack_18.m_internal = buffer.m_internal;
  ::vk::getBufferMemoryRequirements(&local_58,vk,device,buffer);
  (*allocator->_vptr_Allocator[3])(__return_storage_ptr__,allocator,&local_58,(ulong)vk_local._4_4_)
  ;
  dVar3 = VStack_18.m_internal;
  pVVar2 = device_local;
  pAVar1 = allocator_local;
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&__return_storage_ptr__->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar5 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&__return_storage_ptr__->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar6 = ::vk::Allocation::getOffset(pAVar4);
  result = (**(code **)(*(long *)pVVar2 + 0x60))(pVVar2,pAVar1,dVar3,VVar5.m_internal,VVar6);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(device, buffer, alloc->getMemory(), alloc->getOffset())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMakeUtil.cpp"
                    ,0x124);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Allocation> bindBuffer (const DeviceInterface& vk, const VkDevice device, Allocator& allocator, const VkBuffer buffer, const MemoryRequirement requirement)
{
	MovePtr<Allocation> alloc(allocator.allocate(getBufferMemoryRequirements(vk, device, buffer), requirement));
	VK_CHECK(vk.bindBufferMemory(device, buffer, alloc->getMemory(), alloc->getOffset()));
	return alloc;
}